

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Initialize(ImGuiContext *context)

{
  int *piVar1;
  ImGuiSettingsHandler *pIVar2;
  ImU32 IVar3;
  int iVar4;
  ImGuiSettingsHandler *__dest;
  int iVar5;
  int iVar6;
  
  if ((context->Initialized == false) && (context->SettingsLoaded != true)) {
    IVar3 = ImHashStr("Window",0,0);
    iVar4 = (context->SettingsHandlers).Size;
    if (iVar4 == (context->SettingsHandlers).Capacity) {
      if (iVar4 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar4 / 2 + iVar4;
      }
      iVar6 = iVar4 + 1;
      if (iVar4 + 1 < iVar5) {
        iVar6 = iVar5;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiSettingsHandler *)
               (*GImAllocatorAllocFunc)((long)iVar6 * 0x30,GImAllocatorUserData);
      pIVar2 = (context->SettingsHandlers).Data;
      if (pIVar2 != (ImGuiSettingsHandler *)0x0) {
        memcpy(__dest,pIVar2,(long)(context->SettingsHandlers).Size * 0x30);
        pIVar2 = (context->SettingsHandlers).Data;
        if ((pIVar2 != (ImGuiSettingsHandler *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
      }
      (context->SettingsHandlers).Data = __dest;
      (context->SettingsHandlers).Capacity = iVar6;
      iVar4 = (context->SettingsHandlers).Size;
    }
    else {
      __dest = (context->SettingsHandlers).Data;
    }
    __dest[iVar4].TypeName = "Window";
    __dest[iVar4].TypeHash = IVar3;
    *(undefined4 *)&__dest[iVar4].field_0xc = 0;
    __dest[iVar4].ReadOpenFn = SettingsHandlerWindow_ReadOpen;
    __dest[iVar4].ReadLineFn = SettingsHandlerWindow_ReadLine;
    __dest[iVar4].WriteAllFn = SettingsHandlerWindow_WriteAll;
    __dest[iVar4].UserData = (void *)0x0;
    (context->SettingsHandlers).Size = (context->SettingsHandlers).Size + 1;
    context->Initialized = true;
    return;
  }
  __assert_fail("!g.Initialized && !g.SettingsLoaded",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                ,0xe38,"void ImGui::Initialize(ImGuiContext *)");
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    ImGuiSettingsHandler ini_handler;
    ini_handler.TypeName = "Window";
    ini_handler.TypeHash = ImHashStr("Window");
    ini_handler.ReadOpenFn = SettingsHandlerWindow_ReadOpen;
    ini_handler.ReadLineFn = SettingsHandlerWindow_ReadLine;
    ini_handler.WriteAllFn = SettingsHandlerWindow_WriteAll;
    g.SettingsHandlers.push_back(ini_handler);

    g.Initialized = true;
}